

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O2

void __thiscall FTextureManager::UpdateAnimations(FTextureManager *this,DWORD mstime)

{
  WORD *pWVar1;
  WORD WVar2;
  FAnimDef *this_00;
  ushort uVar3;
  DWORD DVar4;
  FTextureID fromtexnum;
  FTextureID totexnum;
  ulong uVar5;
  uint i;
  uint uVar6;
  
  uVar5 = 0;
  do {
    if ((this->mAnimations).Count <= uVar5) {
      return;
    }
    this_00 = (this->mAnimations).Array[uVar5];
    DVar4 = this_00->SwitchTime;
    if (DVar4 == 0) {
      FAnimDef::SetSwitchTime(this_00,mstime);
    }
    else {
      while (DVar4 <= mstime) {
        switch(this_00->AnimType) {
        case '\x01':
          WVar2 = this_00->CurFrame;
          if (WVar2 == 0) {
            WVar2 = this_00->NumFrames;
          }
          WVar2 = WVar2 - 1;
LAB_005844e6:
          this_00->CurFrame = WVar2;
          break;
        case '\x02':
          uVar3 = this_00->CurFrame + 1;
          this_00->CurFrame = uVar3;
          if ((int)(this_00->NumFrames - 1) <= (int)(uint)uVar3) {
            this_00->AnimType = '\x03';
          }
          break;
        case '\x03':
          pWVar1 = &this_00->CurFrame;
          *pWVar1 = *pWVar1 - 1;
          if (*pWVar1 == 0) {
            this_00->AnimType = '\x02';
          }
          break;
        case '\x04':
          if (1 < this_00->NumFrames) {
            uVar6 = FRandom::operator()(&pr_animatepictures,this_00->NumFrames - 1);
            WVar2 = ((short)uVar6 + 1) - (ushort)((uVar6 & 0xffff) < (uint)this_00->CurFrame);
            goto LAB_005844e6;
          }
          break;
        default:
          this_00->CurFrame = (WORD)((this_00->CurFrame + 1) % (uint)this_00->NumFrames);
        }
        FAnimDef::SetSwitchTime(this_00,mstime);
        DVar4 = this_00->SwitchTime;
      }
    }
    if (this_00->bDiscrete == false) {
      for (uVar6 = 0; uVar6 < this_00->NumFrames; uVar6 = uVar6 + 1) {
        fromtexnum = FTextureID::operator+(&this_00->BasePic,uVar6);
        totexnum = FTextureID::operator+
                             (&this_00->BasePic,
                              (this_00->CurFrame + uVar6) % (uint)this_00->NumFrames);
        SetTranslation(this,fromtexnum,totexnum);
      }
    }
    else {
      SetTranslation(this,(FTextureID)(this_00->BasePic).texnum,
                     (FTextureID)this_00->Frames[this_00->CurFrame].FramePic.texnum);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void FTextureManager::UpdateAnimations (DWORD mstime)
{
	for (unsigned int j = 0; j < mAnimations.Size(); ++j)
	{
		FAnimDef *anim = mAnimations[j];

		// If this is the first time through R_UpdateAnimations, just
		// initialize the anim's switch time without actually animating.
		if (anim->SwitchTime == 0)
		{
			anim->SetSwitchTime (mstime);
		}
		else while (anim->SwitchTime <= mstime)
		{ // Multiple frames may have passed since the last time calling
		  // R_UpdateAnimations, so be sure to loop through them all.

			switch (anim->AnimType)
			{
			default:
			case FAnimDef::ANIM_Forward:
				anim->CurFrame = (anim->CurFrame + 1) % anim->NumFrames;
				break;

			case FAnimDef::ANIM_Backward:
				if (anim->CurFrame == 0)
				{
					anim->CurFrame = anim->NumFrames - 1;
				}
				else
				{
					anim->CurFrame -= 1;
				}
				break;

			case FAnimDef::ANIM_Random:
				// select a random frame other than the current one
				if (anim->NumFrames > 1)
				{
					WORD rndFrame = (WORD)pr_animatepictures(anim->NumFrames - 1);
					if (rndFrame >= anim->CurFrame) rndFrame++;
					anim->CurFrame = rndFrame;
				}
				break;

			case FAnimDef::ANIM_OscillateUp:
				anim->CurFrame = anim->CurFrame + 1;
				if (anim->CurFrame >= anim->NumFrames - 1)
				{
					anim->AnimType = FAnimDef::ANIM_OscillateDown;
				}
				break;

			case FAnimDef::ANIM_OscillateDown:
				anim->CurFrame = anim->CurFrame - 1;
				if (anim->CurFrame == 0)
				{
					anim->AnimType = FAnimDef::ANIM_OscillateUp;
				}
				break;
			}
			anim->SetSwitchTime (mstime);
		}

		if (anim->bDiscrete)
		{
			SetTranslation (anim->BasePic, anim->Frames[anim->CurFrame].FramePic);
		}
		else
		{
			for (unsigned int i = 0; i < anim->NumFrames; i++)
			{
				SetTranslation (anim->BasePic + i, anim->BasePic + (i + anim->CurFrame) % anim->NumFrames);
			}
		}
	}
}